

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O0

ValueIterator * __thiscall
llvm::iterator_range<llvm::DWARFDebugNames::ValueIterator>::end
          (ValueIterator *__return_storage_ptr__,
          iterator_range<llvm::DWARFDebugNames::ValueIterator> *this)

{
  iterator_range<llvm::DWARFDebugNames::ValueIterator> *this_local;
  
  DWARFDebugNames::ValueIterator::ValueIterator(__return_storage_ptr__,&this->end_iterator);
  return __return_storage_ptr__;
}

Assistant:

IteratorT end() const { return end_iterator; }